

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O0

LogStream * __thiscall cppnet::LogStream::operator<<(LogStream *this,string *v)

{
  uint uVar1;
  uint32_t uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  undefined8 uVar7;
  string *v_local;
  LogStream *this_local;
  
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if ((bVar4) &&
     (peVar6 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this), peVar6->_len < 0x400)) {
    peVar6 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pcVar3 = peVar6->_log;
    peVar6 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar1 = peVar6->_len;
    peVar6 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar2 = peVar6->_len;
    uVar7 = std::__cxx11::string::c_str();
    iVar5 = snprintf(pcVar3 + uVar1,(ulong)(0x400 - uVar2),"%s",uVar7);
    peVar6 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar6->_len = iVar5 + peVar6->_len;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(const std::string& v) {
    CHECK_CONTINUE()

    _log->_len += snprintf(_log->_log + _log->_len, __log_block_size - _log->_len, "%s", v.c_str());
    return *this;
}